

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O0

void __thiscall btDbvt::collideTV(btDbvt *this,btDbvtNode *root,btDbvtVolume *vol,ICollide *policy)

{
  bool bVar1;
  int iVar2;
  btDbvtNode **ppbVar3;
  long *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  btDbvtNode *n;
  btAlignedObjectArray<const_btDbvtNode_*> stack;
  btDbvtVolume volume;
  btAlignedObjectArray<const_btDbvtNode_*> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  btAlignedObjectArray<const_btDbvtNode_*> *this_00;
  undefined8 in_stack_ffffffffffffff78;
  btDbvtNode *b;
  btAlignedObjectArray<const_btDbvtNode_*> *in_stack_ffffffffffffff80;
  btAlignedObjectArray<const_btDbvtNode_*> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long *local_20;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  if (in_RSI != 0) {
    local_48 = *in_RDX;
    uStack_40 = in_RDX[1];
    local_38 = in_RDX[2];
    uStack_30 = in_RDX[3];
    this_00 = &local_68;
    local_20 = in_RCX;
    btAlignedObjectArray<const_btDbvtNode_*>::btAlignedObjectArray(in_stack_ffffffffffffff60);
    btAlignedObjectArray<const_btDbvtNode_*>::resize
              (in_stack_ffffffffffffff80,iVar2,(btDbvtNode **)this_00);
    btAlignedObjectArray<const_btDbvtNode_*>::reserve(this_00,in_stack_ffffffffffffff6c);
    btAlignedObjectArray<const_btDbvtNode_*>::push_back
              (this_00,(btDbvtNode **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
    ;
    do {
      iVar2 = btAlignedObjectArray<const_btDbvtNode_*>::size(&local_68);
      ppbVar3 = btAlignedObjectArray<const_btDbvtNode_*>::operator[](&local_68,iVar2 + -1);
      b = *ppbVar3;
      btAlignedObjectArray<const_btDbvtNode_*>::pop_back(&local_68);
      bVar1 = Intersect((btDbvtAabbMm *)in_stack_ffffffffffffff80,&b->volume);
      if (bVar1) {
        bVar1 = btDbvtNode::isinternal((btDbvtNode *)0x16278a);
        if (bVar1) {
          btAlignedObjectArray<const_btDbvtNode_*>::push_back
                    (this_00,(btDbvtNode **)CONCAT44(iVar2,in_stack_ffffffffffffff68));
          btAlignedObjectArray<const_btDbvtNode_*>::push_back
                    (this_00,(btDbvtNode **)CONCAT44(iVar2,in_stack_ffffffffffffff68));
        }
        else {
          (**(code **)(*local_20 + 0x18))(local_20,b);
        }
      }
      iVar2 = btAlignedObjectArray<const_btDbvtNode_*>::size(&local_68);
    } while (0 < iVar2);
    btAlignedObjectArray<const_btDbvtNode_*>::~btAlignedObjectArray
              ((btAlignedObjectArray<const_btDbvtNode_*> *)0x162823);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::collideTV(	const btDbvtNode* root,
								  const btDbvtVolume& vol,
								  DBVT_IPOLICY) const
{
	DBVT_CHECKTYPE
		if(root)
		{
			ATTRIBUTE_ALIGNED16(btDbvtVolume)		volume(vol);
			btAlignedObjectArray<const btDbvtNode*>	stack;
			stack.resize(0);
			stack.reserve(SIMPLE_STACKSIZE);
			stack.push_back(root);
			do	{
				const btDbvtNode*	n=stack[stack.size()-1];
				stack.pop_back();
				if(Intersect(n->volume,volume))
				{
					if(n->isinternal())
					{
						stack.push_back(n->childs[0]);
						stack.push_back(n->childs[1]);
					}
					else
					{
						policy.Process(n);
					}
				}
			} while(stack.size()>0);
		}
}